

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O3

bool __thiscall
SslTcpServerImpl::AddCertificate
          (SslTcpServerImpl *this,char *szCAcertificate,char *szHostCertificate,char *szHostKey)

{
  pointer pSVar1;
  uint uVar2;
  wstring *pwVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  SslServerContext local_90;
  
  OpenSSLWrapper::SslServerContext::SslServerContext(&local_90);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_SslCtx,&local_90);
  local_90.super_SslContext._vptr_SslContext = (_func_int **)&PTR__SslServerContext_00146108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.m_vstrAlpnProtoList);
  OpenSSLWrapper::SslContext::~SslContext(&local_90.super_SslContext);
  uVar2 = OpenSSLWrapper::SslServerContext::SetCertificates
                    ((this->m_SslCtx).
                     super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,szCAcertificate,
                     szHostCertificate,szHostKey);
  if (uVar2 == 1) {
    OpenSSLWrapper::SslServerContext::AddVirtualHost
              ((this->m_SslCtx).
               super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,&this->m_SslCtx);
  }
  else {
    __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
              (&local_d0,vswprintf,0x10,L"%d",(ulong)uVar2);
    pwVar3 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_d0,0,(wchar_t *)0x0,0x133820);
    std::__cxx11::wstring::wstring((wstring *)local_b0,pwVar3);
    pwVar3 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_b0);
    std::__cxx11::wstring::wstring((wstring *)&local_90,pwVar3);
    OutputDebugString((wchar_t *)local_90.super_SslContext._vptr_SslContext);
    if ((string *)local_90.super_SslContext._vptr_SslContext !=
        &local_90.super_SslContext.m_strCertComName) {
      operator_delete(local_90.super_SslContext._vptr_SslContext,
                      (long)local_90.super_SslContext.m_strCertComName._M_dataplus._M_p * 4 + 4);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity * 4 + 4);
    }
    pSVar1 = (this->m_SslCtx).
             super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_SslCtx).
    super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
    (**pSVar1[-1].super_SslContext._vptr_SslContext)();
  }
  return uVar2 == 1;
}

Assistant:

bool SslTcpServerImpl::AddCertificate(const char* const szCAcertificate, const char* const szHostCertificate, const char* const szHostKey)
{
    m_SslCtx.emplace_back(SslServerContext());
    const int iRet = m_SslCtx.back().SetCertificates(szCAcertificate, szHostCertificate, szHostKey);
    if (iRet != 1)
    {
        OutputDebugString(wstring(L"Certificate could not be loaded, error: " + to_wstring(iRet) + L"\r\n").c_str());
        m_SslCtx.pop_back();
        return false;
    }
    m_SslCtx.back().AddVirtualHost(&m_SslCtx);
    return true;
}